

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O3

int __thiscall dic::dictAdd(dic *this,int dictidx,void *key,void *obj)

{
  ((this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.super__Vector_impl_data.
   _M_start[dictidx].type)->hashFunction = murmurhash2;
  return -1;
}

Assistant:

int dic::dictAdd(int dictidx,void *key,void *obj){
    dc[dictidx].type->hashFunction=dic::murmurhash2;
    int hash=dc[dictidx].type->hashFunction(key);
    int index=hash&dc[dictidx].ht[0].sizemask;
    if(dic::dict_find(dictidx,0,key)==NULL){
        if(dc[dictidx].ht[0].table[index]==NULL){
            dc[dictidx].ht[0].table[index]->key=key;
            dc[dictidx].ht[0].table[index]->v.val=obj;
            dc[dictidx].ht[0].table[index]->next=NULL;
        }else{
            dictEntry *tmp=dc[dictidx].ht[0].table[index];  
            while(tmp!=NULL)
                tmp=tmp->next;
            dictEntry *newEntry=NULL;
            newEntry->key=key;
            newEntry->v.val=obj;
            newEntry->next=NULL;
            tmp->next=newEntry;
        }
        dc[dictidx].ht[0].used++;
        if(dc[dictidx].ht[0].used/dc[dictidx].ht[0].size>=1)
            dic::rehash(dictidx);
        //if rehash

        return index;}  
    else return -1;//already in 
}